

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * createResult(DdManager *dd,uint index,uint phase,DdNode *cube,double distance)

{
  DdNode *T;
  DdHalfWord local_4c;
  int local_44;
  DdNode *constant;
  DdNode *res;
  double distance_local;
  DdNode *cube_local;
  uint phase_local;
  uint index_local;
  DdManager *dd_local;
  
  if ((index != 0x7fffffff) ||
     (dd_local = (DdManager *)cube, *(int *)((ulong)cube & 0xfffffffffffffffe) != 0x7fffffff)) {
    T = cuddUniqueConst(dd,-distance);
    if (T == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
      if (index == 0x7fffffff) {
        if ((cube->type).kids.T == dd->zero) {
          constant = cuddUniqueInter(dd,cube->index,T,(cube->type).kids.E);
        }
        else {
          constant = cuddUniqueInter(dd,cube->index,(cube->type).kids.T,T);
        }
      }
      else {
        if (index == 0x7fffffff) {
          local_44 = 0x7fffffff;
        }
        else {
          local_44 = dd->perm[index];
        }
        if (cube->index == 0x7fffffff) {
          local_4c = cube->index;
        }
        else {
          local_4c = dd->perm[cube->index];
        }
        if ((int)local_4c <= local_44) {
          __assert_fail("cuddI(dd,index) < cuddI(dd,cube->index)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                        ,0x7df,
                        "DdNode *createResult(DdManager *, unsigned int, unsigned int, DdNode *, double)"
                       );
        }
        if (phase == 0) {
          constant = cuddUniqueInter(dd,index,T,cube);
        }
        else {
          constant = cuddUniqueInter(dd,index,cube,T);
        }
      }
      if (constant == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,T);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
        dd_local = (DdManager *)constant;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
createResult(
  DdManager *dd,
  unsigned int index,
  unsigned int phase,
  DdNode *cube,
  CUDD_VALUE_TYPE distance)
{
    DdNode *res, *constant;

    /* Special case.  The cube is either one or zero, and we do not
    ** add any variables.  Hence, the result is also one or zero,
    ** and the distance remains implied by the value of the constant. */
    if (index == CUDD_CONST_INDEX && Cudd_IsConstant(cube)) return(cube);

    constant = cuddUniqueConst(dd,-distance);
    if (constant == NULL) return(NULL);
    cuddRef(constant);

    if (index == CUDD_CONST_INDEX) {
        /* Replace the top node. */
        if (cuddT(cube) == DD_ZERO(dd)) {
            res = cuddUniqueInter(dd,cube->index,constant,cuddE(cube));
        } else {
            res = cuddUniqueInter(dd,cube->index,cuddT(cube),constant);
        }
    } else {
        /* Add a new top node. */
#ifdef DD_DEBUG
        assert(cuddI(dd,index) < cuddI(dd,cube->index));
#endif
        if (phase) {
            res = cuddUniqueInter(dd,index,cube,constant);
        } else {
            res = cuddUniqueInter(dd,index,constant,cube);
        }
    }
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, constant);
        return(NULL);
    }
    cuddDeref(constant); /* safe because constant is part of res */

    return(res);

}